

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

TapBranchInfoStruct * __thiscall
cfd::js::api::json::TapBranchInfo::ConvertToStruct
          (TapBranchInfoStruct *__return_storage_ptr__,TapBranchInfo *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  undefined1 local_19;
  TapBranchInfo *local_18;
  TapBranchInfo *this_local;
  TapBranchInfoStruct *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (TapBranchInfo *)__return_storage_ptr__;
  TapBranchInfoStruct::TapBranchInfoStruct(__return_storage_ptr__);
  std::__cxx11::string::operator=
            ((string *)__return_storage_ptr__,(string *)&this->top_branch_hash_);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertToStruct(&local_48,&this->nodes_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->nodes,&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->tree_string,(string *)&this->tree_string_);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

TapBranchInfoStruct TapBranchInfo::ConvertToStruct() const {  // NOLINT
  TapBranchInfoStruct result;
  result.top_branch_hash = top_branch_hash_;
  result.nodes = nodes_.ConvertToStruct();
  result.tree_string = tree_string_;
  result.ignore_items = ignore_items;
  return result;
}